

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fa1a8::is_not_duplicate_number_predicate::~is_not_duplicate_number_predicate
          (is_not_duplicate_number_predicate *this)

{
  is_not_duplicate_number_predicate *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->results);
  return;
}

Assistant:

bool operator()(const std::string &line, const std::regex &re) {
        std::smatch match;
        // if there are matches
        if (std::regex_search(line, match, re)) {
            // Depending the case can be in the 2nd or 3rd group
            const auto case_group = [&](size_t index){return std::ssub_match(match[index]).str();};
            const auto number = (case_group(2).size() == 0)
                    ? case_group(3)
                    : case_group(2);
            // Check if it's already defined
            // If it's not add it
            if (!std::any_of(std::begin(results), std::end(results)
                             , [&](const std::string& index){ return index == number; })) {
                results.push_back(number);
                return true;
            }
        }
        return false;
    }